

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob_detection.cpp
# Opt level: O3

void __thiscall Blob_Detection::BlobInfo::_getElongation(BlobInfo *this)

{
  undefined1 auVar1 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> *contourX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *contourY;
  PointBase2D<unsigned_int> *startPoint_00;
  pointer puVar2;
  pointer puVar3;
  byte bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  ulong uVar12;
  uint uVar13;
  double *pdVar14;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __result;
  ulong uVar15;
  double *pdVar16;
  double *pdVar17;
  double *pdVar18;
  undefined1 auVar21 [32];
  undefined1 auVar19 [32];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  double dVar29;
  double dVar30;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 extraout_var [56];
  undefined1 auVar33 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 in_ZMM2 [64];
  PointBase2D<unsigned_int> endPoint;
  PointBase2D<unsigned_int> startPoint;
  vector<double,_std::allocator<double>_> contourYTemp;
  allocator_type local_71;
  double local_70;
  undefined1 local_68 [16];
  double local_58;
  undefined8 local_48;
  PointBase2D<unsigned_int> local_40;
  double *local_38;
  double *local_30;
  undefined1 auVar20 [32];
  
  auVar31 = in_ZMM2._0_16_;
  auVar33 = in_ZMM1._0_16_;
  contourX = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             (this->_contourX).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
  contourY = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             (this->_contourX).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (((contourX != contourY) &&
      (startPoint_00 =
            (PointBase2D<unsigned_int> *)
            (this->_contourY).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start,
      startPoint_00 !=
      (PointBase2D<unsigned_int> *)
      (this->_contourY).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish)) && ((this->_elongation).found == false)) {
    if ((ulong)((long)contourY - (long)contourX) < 5) {
      (this->_elongation).value = 1.0;
    }
    else {
      local_40.x = 0;
      local_40.y = 0;
      local_48 = 0;
      local_70 = anon_unknown.dwarf_1da28::getLengthFromCountour
                           (contourX,contourY,startPoint_00,&local_40);
      uVar13 = local_40.y;
      auVar11 = vcvtusi2sd_avx512f(auVar33,local_48._4_4_ - local_40.y);
      auVar33 = vcvtusi2sd_avx512f(auVar33,(int)local_48 - local_40.x);
      auVar22._0_8_ = atan2(auVar11._0_8_,auVar33._0_8_);
      auVar22._8_56_ = extraout_var;
      auVar33._8_8_ = 0x8000000000000000;
      auVar33._0_8_ = 0x8000000000000000;
      local_68 = vxorpd_avx512vl(auVar22._0_16_,auVar33);
      local_58 = cos(local_68._0_8_);
      local_68._0_8_ = sin((double)local_68._0_8_);
      local_68._8_8_ = extraout_XMM0_Qb;
      std::vector<double,std::allocator<double>>::
      vector<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
                ((vector<double,std::allocator<double>> *)&local_38,
                 (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )(this->_contourY).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )(this->_contourY).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&local_71);
      puVar2 = (this->_contourX).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar3 = (this->_contourX).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (puVar2 != puVar3) {
        auVar11._8_8_ = 0;
        auVar11._0_8_ = local_58;
        auVar22 = vbroadcastsd_avx512f(auVar11);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = local_68._0_8_;
        auVar23 = vbroadcastsd_avx512f(auVar1);
        auVar24 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar19 = vpbroadcastd_avx512vl();
        uVar15 = 0;
        auVar25 = vpbroadcastq_avx512f();
        auVar33 = vcvtusi2sd_avx512f(auVar31,uVar13);
        auVar25 = vpsrlq_avx512f(auVar25,2);
        auVar26 = vbroadcastsd_avx512f(auVar33);
        do {
          auVar27 = vpbroadcastq_avx512f();
          auVar27 = vporq_avx512f(auVar27,auVar24);
          uVar12 = vpcmpuq_avx512f(auVar27,auVar25,2);
          pdVar14 = local_38 + uVar15;
          bVar4 = (byte)uVar12;
          auVar27._8_8_ = (ulong)((byte)(uVar12 >> 1) & 1) * (long)pdVar14[1];
          auVar27._0_8_ = (ulong)(bVar4 & 1) * (long)*pdVar14;
          auVar27._16_8_ = (ulong)((byte)(uVar12 >> 2) & 1) * (long)pdVar14[2];
          auVar27._24_8_ = (ulong)((byte)(uVar12 >> 3) & 1) * (long)pdVar14[3];
          auVar27._32_8_ = (ulong)((byte)(uVar12 >> 4) & 1) * (long)pdVar14[4];
          auVar27._40_8_ = (ulong)((byte)(uVar12 >> 5) & 1) * (long)pdVar14[5];
          auVar27._48_8_ = (ulong)((byte)(uVar12 >> 6) & 1) * (long)pdVar14[6];
          auVar27._56_8_ = (uVar12 >> 7) * (long)pdVar14[7];
          auVar20 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(puVar2 + uVar15));
          auVar21._4_4_ = (uint)((byte)(uVar12 >> 1) & 1) * auVar20._4_4_;
          auVar21._0_4_ = (uint)(bVar4 & 1) * auVar20._0_4_;
          auVar21._8_4_ = (uint)((byte)(uVar12 >> 2) & 1) * auVar20._8_4_;
          auVar21._12_4_ = (uint)((byte)(uVar12 >> 3) & 1) * auVar20._12_4_;
          auVar21._16_4_ = (uint)((byte)(uVar12 >> 4) & 1) * auVar20._16_4_;
          auVar21._20_4_ = (uint)((byte)(uVar12 >> 5) & 1) * auVar20._20_4_;
          auVar21._24_4_ = (uint)((byte)(uVar12 >> 6) & 1) * auVar20._24_4_;
          auVar21._28_4_ = (uint)(byte)(uVar12 >> 7) * auVar20._28_4_;
          auVar27 = vsubpd_avx512f(auVar27,auVar26);
          auVar20 = vpsubd_avx2(auVar21,auVar19);
          auVar28 = vcvtudq2pd_avx512f(auVar20);
          auVar27 = vmulpd_avx512f(auVar22,auVar27);
          auVar27 = vfmadd231pd_avx512f(auVar27,auVar23,auVar28);
          pdVar14 = local_38 + uVar15;
          bVar5 = (bool)((byte)(uVar12 >> 1) & 1);
          bVar6 = (bool)((byte)(uVar12 >> 2) & 1);
          bVar7 = (bool)((byte)(uVar12 >> 3) & 1);
          bVar8 = (bool)((byte)(uVar12 >> 4) & 1);
          bVar9 = (bool)((byte)(uVar12 >> 5) & 1);
          bVar10 = (bool)((byte)(uVar12 >> 6) & 1);
          *pdVar14 = (double)((ulong)(bVar4 & 1) * auVar27._0_8_ |
                             (ulong)!(bool)(bVar4 & 1) * (long)*pdVar14);
          pdVar14[1] = (double)((ulong)bVar5 * auVar27._8_8_ | (ulong)!bVar5 * (long)pdVar14[1]);
          pdVar14[2] = (double)((ulong)bVar6 * auVar27._16_8_ | (ulong)!bVar6 * (long)pdVar14[2]);
          pdVar14[3] = (double)((ulong)bVar7 * auVar27._24_8_ | (ulong)!bVar7 * (long)pdVar14[3]);
          pdVar14[4] = (double)((ulong)bVar8 * auVar27._32_8_ | (ulong)!bVar8 * (long)pdVar14[4]);
          pdVar14[5] = (double)((ulong)bVar9 * auVar27._40_8_ | (ulong)!bVar9 * (long)pdVar14[5]);
          pdVar14[6] = (double)((ulong)bVar10 * auVar27._48_8_ | (ulong)!bVar10 * (long)pdVar14[6]);
          pdVar14[7] = (double)((uVar12 >> 7) * auVar27._56_8_ |
                               (ulong)!SUB81(uVar12 >> 7,0) * (long)pdVar14[7]);
          uVar15 = uVar15 + 8;
        } while ((((ulong)((long)puVar3 + (-4 - (long)puVar2)) >> 2) + 8 & 0xfffffffffffffff8) !=
                 uVar15);
      }
      dVar30 = *local_38;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = dVar30;
      pdVar14 = local_38 + 1;
      pdVar17 = local_38;
      pdVar16 = local_38;
      pdVar18 = pdVar14;
      auVar33 = auVar31;
      if (pdVar14 != local_30 && local_38 != local_30) {
        do {
          auVar34._8_8_ = 0;
          auVar34._0_8_ = *pdVar18;
          auVar11 = vmaxsd_avx(auVar34,auVar33);
          if (auVar33._0_8_ < *pdVar18) {
            pdVar16 = pdVar18;
          }
          pdVar18 = pdVar18 + 1;
          auVar33 = auVar11;
        } while (pdVar18 != local_30);
        dVar30 = *pdVar16;
        do {
          auVar35._8_8_ = 0;
          auVar35._0_8_ = *pdVar14;
          dVar29 = auVar31._0_8_;
          auVar31 = vminsd_avx(auVar35,auVar31);
          if (*pdVar14 < dVar29) {
            pdVar17 = pdVar14;
          }
          pdVar14 = pdVar14 + 1;
        } while (pdVar14 != local_30);
      }
      auVar32._8_8_ = 0;
      auVar32._0_8_ = dVar30 - *pdVar17;
      auVar33 = vmaxsd_avx(ZEXT816(0x3ff0000000000000),auVar32);
      (this->_elongation).value = local_70 / auVar33._0_8_;
      operator_delete(local_38);
    }
    (this->_elongation).found = true;
  }
  return;
}

Assistant:

void BlobInfo::_getElongation()
    {
        if( !_contourX.empty() && !_contourY.empty() && !_elongation.found ) {
            if( _contourX.size() > 1 ) {
                PointBase2D< uint32_t > startPoint;
                PointBase2D< uint32_t > endPoint;
                const double length = getLengthFromCountour( _contourX, _contourY, startPoint, endPoint );
                const double angle = -atan2( static_cast<double>(endPoint.y - startPoint.y),
                                             static_cast<double>(endPoint.x - startPoint.x) );

                const double _cos = cos( angle );
                const double _sin = sin( angle );

                std::vector < double > contourYTemp( _contourY.begin(), _contourY.end() );

                std::vector < uint32_t >::const_iterator xRotated   = _contourX.begin();
                std::vector < double >::iterator yRotated           = contourYTemp.begin();
                std::vector < uint32_t >::const_iterator endRotated = _contourX.end();

                for( ; xRotated != endRotated; ++xRotated, ++yRotated )
                    (*yRotated) = (*xRotated - startPoint.x) * _sin + (*yRotated - startPoint.y) * _cos;

                double height = *(std::max_element( contourYTemp.begin(), contourYTemp.end() )) -
                    *(std::min_element( contourYTemp.begin(), contourYTemp.end() ));

                if( height < 1 )
                    height = 1;

                _elongation.value = length / height;
            }
            else {
                _elongation.value = 1;
            }

            _elongation.found = true;
        }
    }